

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser * init_parse_object_property(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_object_property_name);
  parser_reg(p,"code str code",parse_object_property_code);
  parser_reg(p,"type str type",parse_object_property_type);
  parser_reg(p,"subtype str subtype",parse_object_property_subtype);
  parser_reg(p,"id-type str id",parse_object_property_id_type);
  parser_reg(p,"adjective str adj",parse_object_property_adjective);
  parser_reg(p,"neg-adjective str neg_adj",parse_object_property_neg_adj);
  parser_reg(p,"msg str msg",parse_object_property_msg);
  parser_reg(p,"desc str desc",parse_object_property_desc);
  parser_reg(p,"price-constant int value",parse_object_property_price_constant);
  parser_reg(p,"price-linear int value",parse_object_property_price_linear);
  parser_reg(p,"price-square int value",parse_object_property_price_square);
  parser_reg(p,"design-constant int value",parse_object_property_design_constant);
  parser_reg(p,"design-linear int value",parse_object_property_design_linear);
  parser_reg(p,"design-square int value",parse_object_property_design_square);
  parser_reg(p,"bindui sym ui int aux ?int uival",parse_object_property_bindui);
  return p;
}

Assistant:

static struct parser *init_parse_object_property(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_object_property_name);
	parser_reg(p, "code str code", parse_object_property_code);
	parser_reg(p, "type str type", parse_object_property_type);
	parser_reg(p, "subtype str subtype", parse_object_property_subtype);
	parser_reg(p, "id-type str id", parse_object_property_id_type);
	parser_reg(p, "adjective str adj", parse_object_property_adjective);
	parser_reg(p, "neg-adjective str neg_adj", parse_object_property_neg_adj);
	parser_reg(p, "msg str msg", parse_object_property_msg);
	parser_reg(p, "desc str desc", parse_object_property_desc);
	parser_reg(p, "price-constant int value",
			   parse_object_property_price_constant);
	parser_reg(p, "price-linear int value", parse_object_property_price_linear);
	parser_reg(p, "price-square int value", parse_object_property_price_square);
	parser_reg(p, "design-constant int value",
			   parse_object_property_design_constant);
	parser_reg(p, "design-linear int value",
			   parse_object_property_design_linear);
	parser_reg(p, "design-square int value",
			   parse_object_property_design_square);
	parser_reg(p, "bindui sym ui int aux ?int uival", parse_object_property_bindui);
	return p;
}